

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int16_suite::fail_array64_int16_missing_length_eight(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [1];
  
  decoder.current.view._M_str._7_1_ = 0xda;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>
            ((decoder *)local_38,(uchar (*) [1])((long)&decoder.current.view._M_str + 7));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x821,"void compact_int16_suite::fail_array64_int16_missing_length_eight()",local_40,
             &local_44);
  return;
}

Assistant:

void fail_array64_int16_missing_length_eight()
{
    const value_type input[] = { token::code::array64_int16 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}